

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O0

Vec3<float> Imath_3_2::hsv2rgb<float>(Vec3<float> *hsv)

{
  float *in_RSI;
  Vec3<float> *in_RDI;
  undefined8 extraout_XMM0_Qa;
  float b;
  Vec3<float> VVar1;
  Vec3<double> c;
  Vec3<double> v;
  double local_40;
  double local_38;
  double local_30;
  Vec3<double> local_28;
  
  Vec3<double>::Vec3(&local_28,(double)*in_RSI,(double)in_RSI[1],(double)in_RSI[2]);
  Imath_3_2::hsv2rgb_d((Vec3 *)&local_40);
  b = (float)local_38;
  Vec3<float>::Vec3(in_RDI,(float)local_40,b,(float)local_30);
  VVar1.z = b;
  VVar1.x = (float)(int)extraout_XMM0_Qa;
  VVar1.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar1;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Vec3<T>
                                   hsv2rgb (const Vec3<T>& hsv) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        Vec3<double> v = Vec3<double> (
            hsv.x / double (std::numeric_limits<T>::max ()),
            hsv.y / double (std::numeric_limits<T>::max ()),
            hsv.z / double (std::numeric_limits<T>::max ()));
        Vec3<double> c = hsv2rgb_d (v);
        return Vec3<T> (
            (T) (c.x * std::numeric_limits<T>::max ()),
            (T) (c.y * std::numeric_limits<T>::max ()),
            (T) (c.z * std::numeric_limits<T>::max ()));
    }
    else
    {
        Vec3<double> v = Vec3<double> (hsv.x, hsv.y, hsv.z);
        Vec3<double> c = hsv2rgb_d (v);
        return Vec3<T> ((T) c.x, (T) c.y, (T) c.z);
    }
}